

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

archive * archive_read_new(void)

{
  archive *a;
  archive_entry *paVar1;
  
  a = (archive *)calloc(1,0x960);
  if (a != (archive *)0x0) {
    a->magic = 0xdeb0c5;
    a->state = 1;
    paVar1 = archive_entry_new2(a);
    *(archive_entry **)(a + 1) = paVar1;
    if (archive_read_vtable_inited == '\0') {
      archive_read_vtable_av._80_8_ = _archive_filter_bytes;
      archive_read_vtable_av._88_8_ = _archive_filter_code;
      archive_read_vtable_av._96_8_ = _archive_filter_name;
      archive_read_vtable_av._72_8_ = _archive_filter_count;
      archive_read_vtable_av._64_8_ = _archive_read_data_block;
      archive_read_vtable_av._48_8_ = _archive_read_next_header;
      archive_read_vtable_av._56_8_ = _archive_read_next_header2;
      archive_read_vtable_av._8_8_ = _archive_read_free;
      archive_read_vtable_av._0_8_ = _archive_read_close;
      archive_read_vtable_inited = '\x01';
    }
    a->vtable = (archive_vtable_conflict *)archive_read_vtable_av;
  }
  return a;
}

Assistant:

struct archive *
archive_read_new(void)
{
	struct archive_read *a;

	a = (struct archive_read *)malloc(sizeof(*a));
	if (a == NULL)
		return (NULL);
	memset(a, 0, sizeof(*a));
	a->archive.magic = ARCHIVE_READ_MAGIC;

	a->archive.state = ARCHIVE_STATE_NEW;
	a->entry = archive_entry_new2(&a->archive);
	a->archive.vtable = archive_read_vtable();

	return (&a->archive);
}